

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

void preprocessMode(Problem *problem,bool theory)

{
  Unit *this;
  bool bVar1;
  Formula *f;
  FormulaUnit *this_00;
  ostream *poVar2;
  Unit *extraout_RDX;
  Unit *unit;
  Unit *unit_00;
  Unit *extraout_RDX_00;
  UnitList *pUVar3;
  ScopedPtr<Kernel::Problem> prb;
  Preprocess local_60;
  string local_50;
  
  local_60._options = Lib::env;
  local_60._clausify = false;
  local_60._stillSimplify = false;
  if ((Lib::env->_mode).super_OptionValue<Shell::Options::Mode>.actualValue == PREPROCESS2) {
    local_60._clausify = false;
    local_60._stillSimplify = true;
  }
  prb._obj = problem;
  Shell::Preprocess::preprocess(&local_60,problem);
  Shell::UIHelper::outputSymbolDeclarations((ostream *)&std::cout);
  pUVar3 = (prb._obj)->_units;
  unit = extraout_RDX;
  while (pUVar3 != (UnitList *)0x0) {
    this = pUVar3->_head;
    pUVar3 = pUVar3->_tail;
    if ((((Lib::env->_showAll).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 != '\0')
        || (((Lib::env->_showFOOL).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 & 1)
            != 0)) ||
       (((undefined1  [48])this->_inference & (undefined1  [48])0xfe00) != (undefined1  [48])0xd200)
       ) {
      if (theory) {
        f = Kernel::Unit::getFormula(this);
        if (((uint)*(ulong *)&this->_inference & 0x1c) == 8) {
          *(ulong *)&this->_inference = *(ulong *)&this->_inference | 0xc;
        }
        this_00 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
        Kernel::FormulaUnit::FormulaUnit(this_00,f,&this->_inference);
        Shell::TPTPPrinter::toString_abi_cxx11_(&local_50,(TPTPPrinter *)this_00,unit_00);
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::operator<<(poVar2,"\n");
      }
      else {
        Shell::TPTPPrinter::toString_abi_cxx11_(&local_50,(TPTPPrinter *)this,unit);
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::operator<<(poVar2,"\n");
      }
      std::__cxx11::string::~string((string *)&local_50);
      unit = extraout_RDX_00;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             &(Lib::env->_latexOutput).
              super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .actualValue);
  bVar1 = std::operator!=(&local_50,"off");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    outputProblemToLaTeX(prb._obj);
  }
  vampireReturnValue = 0;
  Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr(&prb);
  return;
}

Assistant:

void preprocessMode(Problem* problem, bool theory)
{
  ScopedPtr<Problem> prb(problem);

  TIME_TRACE(TimeTrace::PREPROCESSING);

  // preprocess without clausification
  Shell::Preprocess prepro(*env.options);
  prepro.turnClausifierOff();
  if(env.options->mode() == Options::Mode::PREPROCESS2){
    prepro.keepSimplifyStep();
  }
  prepro.preprocess(*prb);

  //outputSymbolDeclarations also deals with sorts for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);
  UnitList::Iterator units(prb->units());
  while (units.hasNext()) {
    Unit* u = units.next();
    if (!env.options->showFOOL()) {
      if (u->inference().rule() == InferenceRule::FOOL_AXIOM_TRUE_NEQ_FALSE || u->inference().rule() == InferenceRule::FOOL_AXIOM_ALL_IS_TRUE_OR_FALSE) {
        continue;
      }
    }

    if (theory) {
      Formula* f = u->getFormula();

      // CONJECTURE as inputType is evil, as it cannot occur multiple times
      if (u->inference().inputType() == UnitInputType::CONJECTURE) {
        u->inference().setInputType(UnitInputType::NEGATED_CONJECTURE);
      }

      FormulaUnit* fu = new FormulaUnit(f,u->inference()); // we are stealing u's inference which is not nice
      std::cout << TPTPPrinter::toString(fu) << "\n";
    } else {
      std::cout << TPTPPrinter::toString(u) << "\n";
    }
  }

  if(env.options->latexOutput()!="off"){ outputProblemToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}